

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_vfs_info(ma_vfs *pVFS,ma_vfs_file file,ma_file_info *pInfo)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (pInfo != (ma_file_info *)0x0) {
    pInfo->sizeInBytes = 0;
    if (file != (ma_vfs_file)0x0 && pVFS != (ma_vfs *)0x0) {
      if (*(code **)((long)pVFS + 0x38) != (code *)0x0) {
        mVar1 = (**(code **)((long)pVFS + 0x38))();
        return mVar1;
      }
      mVar1 = MA_NOT_IMPLEMENTED;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_info(ma_vfs* pVFS, ma_vfs_file file, ma_file_info* pInfo)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pInfo == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pInfo);

    if (pVFS == NULL || file == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onInfo == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onInfo(pVFS, file, pInfo);
}